

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

void mwUnlink(mwData *mw,char *file,int line)

{
  mwData *pmVar1;
  
  pmVar1 = mw->prev;
  if (pmVar1 == (mwData *)0x0) {
    if (mwHead != mw) {
      mwWrite("internal: <%ld> %s(%d), MW-%p: link1 NULL, but not head\n",mwCounter,file,
              (ulong)(uint)line,mw);
    }
    mwHead = mw->next;
  }
  else if (pmVar1->next == mw) {
    pmVar1->next = mw->next;
  }
  else {
    mwWrite("internal: <%ld> %s(%d), MW-%p: link1 failure\n",mwCounter,file,(ulong)(uint)line,mw);
  }
  pmVar1 = mw->next;
  if (pmVar1 == (mwData *)0x0) {
    if (mwTail != mw) {
      mwWrite("internal: <%ld> %s(%d), MW-%p: link2 NULL, but not tail\n",mwCounter,file,
              (ulong)(uint)line,mw);
    }
    mwTail = mw->prev;
  }
  else {
    if (pmVar1->prev != mw) {
      mwWrite("internal: <%ld> %s(%d), MW-%p: link2 failure\n",mwCounter,file,(ulong)(uint)line,mw);
      return;
    }
    pmVar1->prev = mw->prev;
  }
  return;
}

Assistant:

static void mwUnlink(mwData *mw, const char *file, int line)
{
	if (mw->prev == NULL) {
		if (mwHead != mw)
			mwWrite("internal: <%ld> %s(%d), MW-%p: link1 NULL, but not head\n",
					mwCounter, file, line, mw);
		mwHead = mw->next;
	} else {
		if (mw->prev->next != mw)
			mwWrite("internal: <%ld> %s(%d), MW-%p: link1 failure\n",
					mwCounter, file, line, mw);
		else {
			mw->prev->next = mw->next;
		}
	}
	if (mw->next == NULL) {
		if (mwTail != mw)
			mwWrite("internal: <%ld> %s(%d), MW-%p: link2 NULL, but not tail\n",
					mwCounter, file, line, mw);
		mwTail = mw->prev;
	} else {
		if (mw->next->prev != mw)
			mwWrite("internal: <%ld> %s(%d), MW-%p: link2 failure\n",
					mwCounter, file, line, mw);
		else {
			mw->next->prev = mw->prev;
		}
	}
}